

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O2

void Mpm_ManPrecomputePerms(Mpm_Man_t *p)

{
  char (*pacVar1) [6];
  char cVar2;
  Vec_Int_t *p_00;
  Mpm_Dsd_t *pMVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  abctime aVar7;
  int *__ptr;
  int *__ptr_00;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  Vec_Wrd_t *pVVar11;
  Hsh_IntMan_t *pHVar12;
  abctime aVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  Vec_Int_t **pvConfgRes;
  int iVar17;
  char (*pacVar18) [6];
  ulong uVar19;
  word Entry;
  int iVar20;
  
  uVar4 = Extra_Factorial(6);
  aVar7 = Abc_Clock();
  if (p->pDsd6 != (Mpm_Dsd_t *)0x0) {
    __assert_fail("p->pDsd6 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,0x2fe,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  p->pDsd6 = s_DsdClass6;
  __ptr = Extra_GreyCodeSchedule(6);
  __ptr_00 = Extra_PermSchedule(6);
  pVVar8 = Vec_IntStartFull(0x40000);
  p->vMap2Perm = pVVar8;
  pacVar1 = p->Perm6;
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
    (*pacVar1)[lVar9] = (char)lVar9;
  }
  uVar19 = 0;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar4;
  }
  uVar15 = 0x2c688;
  pacVar18 = pacVar1;
  for (; uVar19 != uVar10; uVar19 = uVar19 + 1) {
    lVar9 = -6;
    if (uVar19 != 0) {
      for (; lVar9 != 0; lVar9 = lVar9 + 1) {
        pacVar18[1][lVar9] = (*pacVar18)[lVar9];
      }
    }
    lVar9 = (long)__ptr_00[uVar19];
    cVar2 = pacVar1[uVar19][lVar9];
    pacVar1[uVar19][lVar9] = pacVar1[uVar19][lVar9 + 1];
    pacVar1[uVar19][(long)__ptr_00[uVar19] + 1] = cVar2;
    bVar14 = (char)__ptr_00[uVar19] * '\x03';
    uVar16 = ((int)uVar15 >> (bVar14 + 3 & 0x1f) ^ (int)uVar15 >> (bVar14 & 0x1f)) & 7;
    uVar15 = uVar15 ^ uVar16 << (bVar14 + 3 & 0x1f) ^ uVar16 << (bVar14 & 0x1f);
    Vec_IntWriteEntry(p->vMap2Perm,uVar15,(int)uVar19);
    pacVar18 = pacVar18 + 1;
  }
  if (uVar15 != 0x2c688) {
    __assert_fail("OneCopy == One",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                  ,800,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
  }
  pVVar8 = Vec_IntAlloc(6);
  uVar15 = 0;
  do {
    if (p->vMap2Perm->nSize <= (int)uVar15) {
      Vec_IntFree(pVVar8);
      if (p->vPerm6 != (Vec_Wrd_t *)0x0) {
        __assert_fail("p->vPerm6 == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                      ,0x355,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
      }
      pVVar11 = Vec_WrdAlloc(uVar4 * 0x253);
      p->vPerm6 = pVVar11;
      lVar9 = 0;
      do {
        if (lVar9 == 0x253) {
          free(__ptr_00);
          free(__ptr);
          pvConfgRes = &p->vConfgRes;
          pHVar12 = Mpm_ManBuildHashTable(pvConfgRes);
          iVar17 = (int)pvConfgRes;
          p->pHash = pHVar12;
          aVar13 = Abc_Clock();
          Abc_Print(iVar17,"%s =","Setting up DSD information");
          Abc_Print(iVar17,"%9.2f sec\n",(double)(aVar13 - aVar7) / 1000000.0);
          return;
        }
        pMVar3 = s_DsdClass6 + lVar9;
        Entry = pMVar3->uTruth;
        for (uVar19 = 0; uVar10 != uVar19; uVar19 = uVar19 + 1) {
          iVar17 = __ptr_00[uVar19];
          bVar14 = (byte)(1L << ((byte)iVar17 & 0x3f));
          Entry = (Entry & s_PMasks[iVar17][2]) >> (bVar14 & 0x3f) |
                  (s_PMasks[iVar17][1] & Entry) << (bVar14 & 0x3f) | s_PMasks[iVar17][0] & Entry;
          Vec_WrdPush(p->vPerm6,Entry);
        }
        lVar9 = lVar9 + 1;
      } while (Entry == pMVar3->uTruth);
      __assert_fail("uTruth == s_DsdClass6[i].uTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                    ,0x35f,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
    }
    Vec_IntEntry(p->vMap2Perm,uVar15);
    Vec_IntFill(pVVar8,6,0);
    iVar17 = 0;
    for (iVar20 = 0; iVar20 != 0x12; iVar20 = iVar20 + 3) {
      uVar16 = uVar15 >> ((byte)iVar20 & 0x1f) & 7;
      if (uVar16 < 6) {
        iVar5 = Vec_IntEntry(pVVar8,uVar16);
        if (iVar5 == 1) goto LAB_007032af;
        Vec_IntWriteEntry(pVVar8,uVar16,1);
        iVar17 = iVar17 + 1;
      }
      else if (uVar16 != 7) goto LAB_007032af;
    }
    if (iVar17 != 6) {
      iVar17 = 0;
      for (iVar20 = 0; iVar20 != 6; iVar20 = iVar20 + 1) {
        iVar5 = Vec_IntEntry(pVVar8,iVar20);
        if (iVar5 == 0) {
          Vec_IntWriteEntry(pVVar8,iVar17,iVar20);
          iVar17 = iVar17 + 1;
        }
      }
      if (pVVar8->nSize < iVar17) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar8->nSize = iVar17;
      iVar20 = 0;
      uVar16 = uVar15;
      for (iVar5 = 0; iVar5 != 0x12; iVar5 = iVar5 + 3) {
        if ((~((int)uVar16 >> ((byte)iVar5 & 0x1f)) & 7U) == 0) {
          uVar6 = Vec_IntEntry(pVVar8,iVar20);
          uVar16 = uVar16 ^ (uVar6 ^ 7) << ((byte)iVar5 & 0x1f);
          iVar20 = iVar20 + 1;
        }
      }
      if (iVar20 != iVar17) {
        __assert_fail("x == Vec_IntSize(vVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                      ,0x346,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
      }
      iVar17 = Vec_IntEntry(p->vMap2Perm,uVar16);
      if (iVar17 == -1) {
        __assert_fail("Vec_IntEntry( p->vMap2Perm, One ) != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmDsd.c"
                      ,0x348,"void Mpm_ManPrecomputePerms(Mpm_Man_t *)");
      }
      p_00 = p->vMap2Perm;
      iVar17 = Vec_IntEntry(p_00,uVar16);
      Vec_IntWriteEntry(p_00,uVar15,iVar17);
    }
LAB_007032af:
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

void Mpm_ManPrecomputePerms( Mpm_Man_t * p )
{
    int nVars = 6;
    // 0(1:1) 1(2:1) 2(4:2) 3(10:6) 4(33:23) 5(131:98) 6(595:464)
    int nClasses[7] = { 1, 2, 4, 10, 33, 131, 595 };
    int nPerms = Extra_Factorial( nVars );
//    int nSwaps = (1 << nVars);
    int * pComp, * pPerm;
    int i, k, x, One, OneCopy, Num;
    Vec_Int_t * vVars;
    abctime clk = Abc_Clock();
    assert( p->pDsd6 == NULL );
    p->pDsd6 = s_DsdClass6;
    // precompute schedules
    pComp = Extra_GreyCodeSchedule( nVars );
    pPerm = Extra_PermSchedule( nVars );
    // map numbers into perms
    p->vMap2Perm = Vec_IntStartFull( (1<<(3*nVars)) );
    // store permutations
    One = 0;
    for ( x = 0; x < nVars; x++ )
    {
        p->Perm6[0][x] = (char)x;
        One |= (x << (3*x));
    }
//    Vec_IntWriteEntry( p->vMap2Perm, One, 0 );
    OneCopy = One;
    for ( k = 0; k < nPerms; k++ )
    {
        if ( k > 0 )
        for ( x = 0; x < nVars; x++ )
            p->Perm6[k][x] = p->Perm6[k-1][x];
        ABC_SWAP( char, p->Perm6[k][pPerm[k]], p->Perm6[k][pPerm[k]+1] );

        Num = ( (One >> (3*(pPerm[k]  ))) ^ (One >> (3*(pPerm[k]+1))) ) & 7;
        One ^=  (Num << (3*(pPerm[k]  )));
        One ^=  (Num << (3*(pPerm[k]+1)));

        Vec_IntWriteEntry( p->vMap2Perm, One, k );
        
//        Mpm_ManPrintPerm( One );
//        for ( x = 0; x < nVars; x++ )
//            printf( "%d ", p->Perm6[k][x] );
//        printf( "\n" );
    }
    assert( OneCopy == One );
    // fill in the gaps
    vVars = Vec_IntAlloc( 6 );
    Vec_IntForEachEntry( p->vMap2Perm, Num, i )
    {
        // mark used variables
        int Count = 0;
        One = i;
        Vec_IntFill( vVars, 6, 0 );
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar >= nVars && iVar < 7 )
                break;
            if ( iVar != 7 )
            {
                if ( Vec_IntEntry( vVars, iVar ) == 1 )
                    break;
                Vec_IntWriteEntry( vVars, iVar, 1 );
                Count++;
            }
        }
        // skip ones with dups and complete
        if ( k < nVars || Count == nVars )
            continue;
        // find unused variables
        for ( x = k = 0; k < 6; k++ )
            if ( Vec_IntEntry(vVars, k) == 0 )
                Vec_IntWriteEntry( vVars, x++, k );
        Vec_IntShrink( vVars, x );
        // fill in used variables
        x = 0;
        for ( k = 0; k < nVars; k++ )
        {
            int iVar = ((One >> (3*k)) & 7);
            if ( iVar == 7 )
                One ^= ((Vec_IntEntry(vVars, x++) ^ 7) << (3*k));
        }
        assert( x == Vec_IntSize(vVars) );
        // save this one
        assert( Vec_IntEntry( p->vMap2Perm, One ) != -1 );
        Vec_IntWriteEntry( p->vMap2Perm, i, Vec_IntEntry(p->vMap2Perm, One) );
/*
        // mapping
        Mpm_ManPrintPerm( i );
        printf( "->  " );
        Mpm_ManPrintPerm( One );
        printf( "\n" );
*/
    }
    Vec_IntFree( vVars );

    // store permuted truth tables
    assert( p->vPerm6 == NULL );
    p->vPerm6 = Vec_WrdAlloc( nPerms * 595 );
    for ( i = 0; i < nClasses[nVars]; i++ )
    {
        word uTruth = s_DsdClass6[i].uTruth;
        for ( k = 0; k < nPerms; k++ )
        {
            uTruth = Abc_Tt6SwapAdjacent( uTruth, pPerm[k] );
            Vec_WrdPush( p->vPerm6, uTruth );
        }
        assert( uTruth == s_DsdClass6[i].uTruth );
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // build hash table
    p->pHash = Mpm_ManBuildHashTable( &p->vConfgRes );
    Abc_PrintTime( 1, "Setting up DSD information", Abc_Clock() - clk );
}